

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O1

void __thiscall
gvr::PointCloud::PointCloud
          (PointCloud *this,PointCloud *p,vector<bool,_std::allocator<bool>_> *vused)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  float *pfVar4;
  uint uVar5;
  ulong uVar6;
  float *pfVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  long lVar12;
  
  (this->super_Model)._vptr_Model = (_func_int **)&PTR__Model_001780b8;
  (this->super_Model).origin.v[0] = 0.0;
  (this->super_Model).origin.v[1] = 0.0;
  (this->super_Model).origin.v[2] = 0.0;
  (this->super_Model).Rc.v[0][0] = 0.0;
  (this->super_Model).Rc.v[0][1] = 0.0;
  (this->super_Model).Rc.v[0][2] = 0.0;
  (this->super_Model).Rc.v[1][0] = 0.0;
  (this->super_Model).Rc.v[1][1] = 0.0;
  (this->super_Model).Rc.v[1][2] = 0.0;
  (this->super_Model).Rc.v[2][0] = 0.0;
  (this->super_Model).Rc.v[2][1] = 0.0;
  (this->super_Model).Rc.v[2][2] = 0.0;
  auVar1 = _DAT_00163c20;
  lVar3 = 0x48;
  auVar11 = _DAT_00163c10;
  do {
    if (SUB164(auVar11 ^ auVar1,4) == -0x80000000 && SUB164(auVar11 ^ auVar1,0) < -0x7ffffffd) {
      *(undefined8 *)((long)(&(this->super_Model).origin + -2) + lVar3) = 0x3ff0000000000000;
      *(undefined8 *)((long)(this->super_Model).origin.v + lVar3 + -0x10) = 0x3ff0000000000000;
    }
    lVar12 = auVar11._8_8_;
    auVar11._0_8_ = auVar11._0_8_ + 2;
    auVar11._8_8_ = lVar12 + 2;
    lVar3 = lVar3 + 0x40;
  } while (lVar3 != 200);
  (this->super_Model).Tc.v[0] = 0.0;
  (this->super_Model).Tc.v[1] = 0.0;
  (this->super_Model).Tc.v[2] = 0.0;
  (this->super_Model).id = (p->super_Model).id;
  lVar3 = 2;
  do {
    (this->super_Model).origin.v[lVar3 + -2] = (p->super_Model).origin.v[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  (this->super_Model)._vptr_Model = (_func_int **)&PTR__PointCloud_00178030;
  this->n = 0;
  this->vertex = (float *)0x0;
  this->scanprop = (float *)0x0;
  this->scanpos = (float *)0x0;
  lVar3 = *(long *)vused;
  uVar5 = *(int *)(vused + 0x18) + ((int)*(undefined8 *)(vused + 0x10) - (int)lVar3) * 8;
  if (0 < (int)uVar5) {
    iVar2 = this->n;
    uVar6 = (ulong)uVar5;
    iVar8 = *(int *)(vused + 0x18) + (int)*(undefined8 *)(vused + 0x10) * 8 + (int)lVar3 * -8 + 1;
    do {
      uVar6 = uVar6 - 1;
      if ((*(ulong *)(lVar3 + (uVar6 >> 6 & 0x3ffffff) * 8) >> (uVar6 & 0x3f) & 1) != 0) {
        iVar2 = iVar2 + 1;
        this->n = iVar2;
      }
      iVar8 = iVar8 + -1;
    } while (1 < iVar8);
  }
  uVar6 = 0xffffffffffffffff;
  if (-1 < (long)this->n) {
    uVar6 = (long)this->n * 0xc;
  }
  pfVar4 = (float *)operator_new__(uVar6);
  this->vertex = pfVar4;
  iVar2 = p->n;
  uVar10 = (ulong)iVar2;
  if (0 < (long)uVar10) {
    pfVar7 = p->vertex + 2;
    uVar9 = 0;
    iVar8 = 0;
    do {
      if ((*(ulong *)(lVar3 + (uVar9 >> 6) * 8) >> (uVar9 & 0x3f) & 1) != 0) {
        pfVar4[iVar8] = pfVar7[-2];
        pfVar4[(long)iVar8 + 1] = pfVar7[-1];
        pfVar4[(long)iVar8 + 2] = *pfVar7;
        iVar8 = iVar8 + 3;
      }
      uVar9 = uVar9 + 1;
      pfVar7 = pfVar7 + 3;
    } while (uVar10 != uVar9);
  }
  if (p->scanprop != (float *)0x0) {
    pfVar4 = (float *)operator_new__(uVar6);
    this->scanprop = pfVar4;
    if (0 < iVar2) {
      pfVar7 = p->scanprop + 2;
      uVar9 = 0;
      iVar8 = 0;
      do {
        if ((*(ulong *)(lVar3 + (uVar9 >> 6) * 8) >> (uVar9 & 0x3f) & 1) != 0) {
          pfVar4[iVar8] = pfVar7[-2];
          pfVar4[(long)iVar8 + 1] = pfVar7[-1];
          pfVar4[(long)iVar8 + 2] = *pfVar7;
          iVar8 = iVar8 + 3;
        }
        uVar9 = uVar9 + 1;
        pfVar7 = pfVar7 + 3;
      } while (uVar10 != uVar9);
    }
  }
  if (p->scanpos != (float *)0x0) {
    pfVar4 = (float *)operator_new__(uVar6);
    this->scanpos = pfVar4;
    if (0 < iVar2) {
      pfVar7 = p->scanpos + 2;
      uVar6 = 0;
      iVar2 = 0;
      do {
        if ((*(ulong *)(lVar3 + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0) {
          pfVar4[iVar2] = pfVar7[-2];
          pfVar4[(long)iVar2 + 1] = pfVar7[-1];
          pfVar4[(long)iVar2 + 2] = *pfVar7;
          iVar2 = iVar2 + 3;
        }
        uVar6 = uVar6 + 1;
        pfVar7 = pfVar7 + 3;
      } while (uVar10 != uVar6);
    }
  }
  return;
}

Assistant:

PointCloud::PointCloud(const PointCloud &p, const std::vector<bool> &vused) : Model(p)
{
  n=0;
  vertex=0;
  scanprop=0;
  scanpos=0;

  for (int i=static_cast<int>(vused.size())-1; i>=0; i--)
  {
    if (vused[i])
    {
      n++;
    }
  }

  vertex=new float [3*n];

  int k=0;

  for (int i=0; i<p.getVertexCount(); i++)
  {
    if (vused[i])
    {
      vertex[k++]=p.getVertexComp(i, 0);
      vertex[k++]=p.getVertexComp(i, 1);
      vertex[k++]=p.getVertexComp(i, 2);
    }
  }

  if (p.hasScanProp())
  {
    scanprop=new float [3*n];

    k=0;

    for (int i=0; i<p.getVertexCount(); i++)
    {
      if (vused[i])
      {
        scanprop[k++]=p.getScanSize(i);
        scanprop[k++]=p.getScanError(i);
        scanprop[k++]=p.getScanConf(i);
      }
    }
  }

  if (p.hasScanPos())
  {
    scanpos=new float [3*n];

    k=0;

    for (int i=0; i<p.getVertexCount(); i++)
    {
      if (vused[i])
      {
        scanpos[k++]=p.getScanPosComp(i, 0);
        scanpos[k++]=p.getScanPosComp(i, 1);
        scanpos[k++]=p.getScanPosComp(i, 2);
      }
    }
  }
}